

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL3_glfw::GLAttributeBuffer::setData_helper<int>
          (GLAttributeBuffer *this,vector<int,_std::allocator<int>_> *data)

{
  pointer piVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  (*glad_glBindBuffer)(0x8892,this->VBOLoc);
  if (((this->super_AttributeBuffer).setFlag != true) ||
     ((this->super_AttributeBuffer).bufferSize <
      (ulong)((long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2))) {
    (this->super_AttributeBuffer).setFlag = true;
    uVar2 = (long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    uVar4 = (this->super_AttributeBuffer).bufferSize * 2;
    if (uVar4 < uVar2) {
      uVar4 = uVar2;
    }
    (*glad_glBufferData)(0x8892,uVar4 * 4,(void *)0x0,0x88e4);
    (this->super_AttributeBuffer).bufferSize = uVar4;
  }
  piVar1 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar3 = (long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  (this->super_AttributeBuffer).dataSize = lVar3 >> 2;
  (*glad_glBufferSubData)(0x8892,0,lVar3,piVar1);
  checkGLError(true);
  return;
}

Assistant:

void GLAttributeBuffer::setData_helper(const std::vector<T>& data) {
  bind();

  // allocate if needed
  if (!isSet() || data.size() > bufferSize) {
    setFlag = true;
    uint64_t newSize = data.size();
    newSize = std::max(newSize, 2 * bufferSize); // if we're expanding, at-least double
    glBufferData(getTarget(), newSize * sizeof(T), NULL, GL_STATIC_DRAW);
    bufferSize = newSize;
  }

  // do the actual copy
  dataSize = data.size();
  glBufferSubData(getTarget(), 0, dataSize * sizeof(T), &data[0]);

  checkGLError();
}